

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

bool nite::isNumber(string *number)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool local_179;
  string local_b0;
  uint local_8c;
  uint local_88;
  uint e;
  uint i;
  bool n;
  string local_60;
  undefined1 local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  undefined1 *local_20;
  string *local_18;
  string *number_local;
  
  local_18 = number;
  if ((isNumber(std::__cxx11::string)::numbers_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_), iVar3 != 0))
  {
    local_3f = 1;
    local_20 = isNumber(std::__cxx11::string)::numbers_abi_cxx11_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)isNumber(std::__cxx11::string)::numbers_abi_cxx11_,"0",&local_21);
    local_20 = (undefined1 *)0x3f80b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0x20),"1",local_35);
    local_20 = (undefined1 *)0x3f80d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0x40),"2",&local_36);
    local_20 = (undefined1 *)0x3f80f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0x60),"3",&local_37);
    local_20 = (undefined1 *)0x3f8110;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0x80),"4",&local_38);
    local_20 = (undefined1 *)0x3f8130;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0xa0),"5",&local_39);
    local_20 = (undefined1 *)0x3f8150;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0xc0),"6",&local_3a);
    local_20 = (undefined1 *)0x3f8170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0xe0),"7",&local_3b);
    local_20 = (undefined1 *)0x3f8190;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0x100),"8",&local_3c)
    ;
    local_20 = (undefined1 *)0x3f81b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0x120),"9",&local_3d)
    ;
    local_20 = (undefined1 *)0x3f81d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 0x140),".",&local_3e)
    ;
    local_3f = 0;
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_);
  }
  strAt(&local_60,number,0);
  e._3_1_ = 0;
  bVar1 = std::operator==(&local_60,"+");
  local_179 = true;
  if (!bVar1) {
    strAt((string *)&i,number,0);
    e._3_1_ = 1;
    local_179 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&i,"-");
  }
  if ((e._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&i);
  }
  std::__cxx11::string::~string((string *)&local_60);
  if (local_179 != false) {
    std::__cxx11::string::erase((ulong)number,0);
  }
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    number_local._7_1_ = false;
  }
  else {
    e._2_1_ = 0;
    for (local_88 = 0; uVar5 = (ulong)local_88, uVar6 = std::__cxx11::string::length(),
        uVar5 < uVar6; local_88 = local_88 + 1) {
      e._2_1_ = 0;
      for (local_8c = 0; local_8c < 0xb; local_8c = local_8c + 1) {
        strAt(&local_b0,number,local_88);
        _Var2 = std::operator==(&local_b0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ +
                                 (ulong)local_8c * 0x20));
        std::__cxx11::string::~string((string *)&local_b0);
        if (_Var2) {
          e._2_1_ = 1;
        }
      }
      if ((e._2_1_ & 1) == 0) {
        return false;
      }
    }
    number_local._7_1_ = true;
  }
  return number_local._7_1_;
}

Assistant:

bool nite::isNumber(String number){
	static const String numbers[]={
		"0","1","2","3","4","5",
		"6","7","8","9","."
	};
	static const unsigned size = sizeof(numbers)/sizeof(String);

	/* remove signs */
	if (nite::strAt(number,0)=="+" or nite::strAt(number,0)=="-")
		number.erase(0,1);

	if (number.length()==0)
		return 0;
	bool n=0;
	for (unsigned i=0; i<number.length(); i++){
		n=0;
		for (unsigned e=0; e<size; e++){
			if (nite::strAt(number,i)==numbers[e])
				n=1;
		}
		if (n==0)
			return 0;
	}
    return 1;

}